

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O1

void hash_df(cf_chash *H,void *in1,size_t nin1,void *in2,size_t nin2,void *in3,size_t nin3,void *in4
            ,size_t nin4,uint8_t *out,size_t nout)

{
  ulong __n;
  ulong uVar1;
  uint8_t counter;
  uint8_t cbuf [4];
  uint8_t block [64];
  cf_chash_ctx ctx;
  char local_225;
  undefined4 local_224;
  size_t local_220;
  code *local_218;
  code *local_210;
  cf_chash *local_208;
  void *local_200;
  void *local_1f8;
  void *local_1f0;
  void *local_1e8;
  void *local_1e0;
  uint8_t local_1d8 [64];
  cf_sha256_context local_198 [3];
  
  local_225 = '\x01';
  local_224 = 0xb8010000;
  local_220 = 0x20;
  local_210 = cf_sha256_init;
  local_218 = cf_sha256_digest;
  uVar1 = 0x37;
  local_208 = H;
  local_200 = in1;
  local_1f8 = (void *)nin1;
  local_1f0 = in2;
  local_1e8 = (void *)nin2;
  local_1e0 = in3;
  do {
    (*local_210)(local_198);
    cf_sha256_update(local_198,&local_225,1);
    cf_sha256_update(local_198,&local_224,4);
    cf_sha256_update(local_198,local_208,(size_t)local_200);
    cf_sha256_update(local_198,local_1f8,(size_t)local_1f0);
    cf_sha256_update(local_198,local_1e8,(size_t)local_1e0);
    cf_sha256_update(local_198,(void *)nin3,(size_t)in4);
    (*local_218)(local_198,local_1d8);
    __n = uVar1;
    if (local_220 < uVar1) {
      __n = local_220;
    }
    memcpy((void *)nin4,local_1d8,__n);
    nin4 = nin4 + __n;
    local_225 = local_225 + '\x01';
    uVar1 = uVar1 - __n;
  } while (uVar1 != 0);
  return;
}

Assistant:

static void hash_df(const cf_chash *H,
                    const void *in1, size_t nin1,
                    const void *in2, size_t nin2,
                    const void *in3, size_t nin3,
                    const void *in4, size_t nin4,
                    uint8_t *out, size_t nout)
{
  uint8_t counter = 1;
  uint32_t bits_to_return = nout * 8;
  uint8_t cbuf[4];
  uint8_t block[CF_MAXHASH];

  write32_be(bits_to_return, cbuf);

  while (nout)
  {
    /* Make a block.  This is the hash of:
     *   counter || bits_to_return || in1 || in2 || in3 | in4
     */
    cf_chash_ctx ctx;
    H->init(&ctx);
    H->update(&ctx, &counter, sizeof counter);
    H->update(&ctx, cbuf, sizeof cbuf);
    H->update(&ctx, in1, nin1);
    H->update(&ctx, in2, nin2);
    H->update(&ctx, in3, nin3);
    H->update(&ctx, in4, nin4);
    H->digest(&ctx, block);

    size_t take = MIN(H->hashsz, nout);
    memcpy(out, block, take);
    out += take;
    nout -= take;

    counter += 1;
  }
}